

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O2

vector<const_char_*,_std::allocator<const_char_*>_> *
EnvProperty::DoDuplicateAndUpdateEnv
          (vector<const_char_*,_std::allocator<const_char_*>_> *__return_storage_ptr__,
          override_set *overrides)

{
  char *__s;
  size_type sVar1;
  size_t sVar2;
  bool bVar3;
  uint uVar4;
  size_type __n;
  value_type __dest;
  ulong uVar5;
  pointer ppVar6;
  ptrdiff_t _Num;
  value_type __dest_00;
  basic_string_view<char,_std::char_traits<char>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  undefined1 local_50 [8];
  string_view k_and_v;
  
  (__return_storage_ptr__->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  k_and_v._M_str = _environ;
  do {
    __s = *(char **)k_and_v._M_str;
    if (__s == (char *)0x0) {
      ppVar6 = (overrides->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      k_and_v._M_str =
           (char *)(overrides->
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
      do {
        if (ppVar6 == (pointer)k_and_v._M_str) {
          local_50 = (undefined1  [8])0x0;
          std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                    ((vector<char_const*,std::allocator<char_const*>> *)__return_storage_ptr__,
                     (char **)local_50);
          return __return_storage_ptr__;
        }
        sVar1 = (ppVar6->second)._M_string_length;
        if (sVar1 != 0) {
          uVar5 = sVar1 + (ppVar6->first)._M_string_length + 2;
          __dest = (value_type)operator_new__(uVar5);
          sVar2 = (ppVar6->first)._M_string_length;
          local_50 = (undefined1  [8])__dest;
          if (sVar2 != 0) {
            memmove(__dest,(ppVar6->first)._M_dataplus._M_p,sVar2);
          }
          __dest_00 = __dest + sVar2 + 1;
          __dest[sVar2] = '=';
          sVar2 = (ppVar6->second)._M_string_length;
          if (sVar2 != 0) {
            memmove(__dest_00,(ppVar6->second)._M_dataplus._M_p,sVar2);
          }
          __dest_00[sVar2] = '\0';
          if (__dest_00 + sVar2 + 1 != __dest + uVar5) {
            fprintf(_stderr,"%s:%d Check failed: %s %s %s\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                    ,0x709,"it","==","new_k_and_v + sz");
            abort();
          }
          std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                    (__return_storage_ptr__,(value_type *)local_50);
        }
        ppVar6 = ppVar6 + 1;
      } while( true );
    }
    local_50 = (undefined1  [8])strlen(__s);
    k_and_v._M_len = (size_t)__s;
    __n = std::basic_string_view<char,_std::char_traits<char>_>::find
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_50,'=',0);
    if (__n == 0xffffffffffffffff) {
      syscall(1,2,"Check failed: pos != std::string_view::npos\n",0x2c);
      abort();
    }
    __y = std::basic_string_view<char,_std::char_traits<char>_>::substr
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_50,0,__n);
    uVar5 = (ulong)((long)(overrides->
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(overrides->
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start) >> 6 & 0xffffffff;
    do {
      uVar5 = uVar5 - 1;
      if ((int)(uint)uVar5 < 0) {
        std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                  (__return_storage_ptr__,(value_type *)k_and_v._M_str);
        break;
      }
      uVar4 = (uint)uVar5 & 0x7fffffff;
      ppVar6 = (overrides->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      __x._M_str = ppVar6[uVar4].first._M_dataplus._M_p;
      __x._M_len = ppVar6[uVar4].first._M_string_length;
      bVar3 = std::operator==(__x,__y);
    } while (!bVar3);
    k_and_v._M_str = k_and_v._M_str + 8;
  } while( true );
}

Assistant:

static std::vector<const char*> DoDuplicateAndUpdateEnv(override_set overrides) {
    std::vector<const char*> vec;

    for (const char* const *p = environ; *p; p++) {
      std::string_view k_and_v{*p};
      auto pos = k_and_v.find('=');
      CHECK(pos != std::string_view::npos);
      std::string_view k = k_and_v.substr(0, pos);
      int i = overrides.size() - 1;;
      for (; i >= 0; i--) {
        if (overrides[i].first == k) {
          break;
        }
      }
      if (i < 0) {
        vec.push_back(*p);
      }
    }

    for (const auto& [k, v] : overrides) {
      if (v.empty()) {
        continue;
      }

      size_t sz = k.size() + v.size() + 1 + 1;
      char* new_k_and_v = new char[sz];
      auto it = std::copy(k.begin(), k.end(), new_k_and_v);
      *it++ = '=';
      it = std::copy(v.begin(), v.end(), it);
      *it++ = '\0';
      CHECK_EQ(it, new_k_and_v + sz);

      vec.push_back(new_k_and_v);
    }

    vec.push_back(nullptr);

    return vec;
  }